

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

str __thiscall pybind11::repr(pybind11 *this,handle h)

{
  long lVar1;
  error_already_set *this_00;
  
  lVar1 = PyObject_Repr(h.m_ptr);
  if (lVar1 != 0) {
    *(long *)this = lVar1;
    return (object)(object)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

inline str repr(handle h) {
    PyObject *str_value = PyObject_Repr(h.ptr());
    if (!str_value) {
        throw error_already_set();
    }
    return reinterpret_steal<str>(str_value);
}